

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkatom.c
# Opt level: O1

DLword compute_hash(char *char_base,DLword offset,DLword length)

{
  ushort uVar1;
  ulong uVar2;
  long lVar3;
  undefined6 in_register_00000032;
  
  uVar2 = CONCAT62(in_register_00000032,offset) & 0xffffffff;
  uVar1 = (ushort)(byte)char_base[uVar2] << 8;
  if (1 < length) {
    lVar3 = 1;
    do {
      uVar1 = (short)char_base[lVar3 + uVar2] + (uVar1 + (uVar1 & 0xfff) * 4) * 0x101;
      lVar3 = lVar3 + 1;
    } while (length != (DLword)lVar3);
  }
  return uVar1;
}

Assistant:

DLword compute_hash(const char *char_base, DLword offset, DLword length) {
  DLword hash;
  DLword number;
  DLword temp1;

  char_base += offset;
  hash = (DLword)((*char_base) << 8); /* get first byte */
  char_base++;                     /* skip length area */

  for (number = 1; number <= length - 1; char_base++, number++) {
    hash = (hash + ((hash & 4095) << 2)) & 0x0ffff;
    temp1 = (hash + ((hash & 255) << 8)) & 0x0ffff;
    hash = (temp1 + (*char_base)) & 0x0ffff;
  }

  return (hash);

}